

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

void auto_recover_compact_ok_test(void)

{
  size_t *psVar1;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  size_t bodylen;
  fdb_kvs_config *config;
  fdb_kvs_info *info_00;
  fdb_file_info *kvs_config_00;
  void *__s2;
  ulong uVar6;
  fdb_kvs_handle **ptr_handle;
  fdb_kvs_handle **ppfVar7;
  fdb_kvs_handle *pfVar8;
  char *pcVar9;
  fdb_doc *unaff_RBP;
  fdb_doc *pfVar10;
  char *pcVar11;
  fdb_file_info *info_01;
  fdb_kvs_handle *ptr_fhandle;
  undefined1 handle [8];
  uint uVar12;
  fdb_kvs_handle *unaff_R12;
  long lVar13;
  fdb_kvs_handle *unaff_R13;
  btree *config_00;
  fdb_kvs_handle *ptr_fhandle_00;
  fdb_config *pfVar14;
  ulong uVar15;
  fdb_doc **doc;
  __atomic_base<unsigned_long> _Var16;
  timeval tVar17;
  timeval tVar18;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db_new;
  fdb_file_handle *dbfile_new;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info info;
  char bodybuf [256];
  fdb_config fconfig;
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_15ce8;
  undefined1 auStack_15ce0 [16];
  undefined1 auStack_15cd0 [8];
  undefined1 auStack_15cc8 [80];
  ulong uStack_15c78;
  timeval tStack_15c58;
  fdb_file_info afStack_15c48 [3];
  fdb_file_info afStack_15b48 [3];
  fdb_config fStack_15a48;
  fdb_kvs_handle *pfStack_15950;
  fdb_kvs_handle *pfStack_15948;
  fdb_kvs_handle *pfStack_15940;
  fdb_config *pfStack_15938;
  fdb_doc **ppfStack_15930;
  fdb_doc *pfStack_15928;
  fdb_file_handle *pfStack_15918;
  fdb_kvs_handle *pfStack_15910;
  timeval atStack_15908 [2];
  timeval tStack_158e8;
  timeval tStack_158d8;
  undefined1 auStack_158c8 [70];
  undefined1 uStack_15882;
  undefined8 uStack_15878;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_157b8;
  fdb_kvs_handle *pfStack_157b0;
  fdb_kvs_handle *pfStack_157a8;
  fdb_kvs_handle *pfStack_157a0;
  fdb_doc **ppfStack_15798;
  fdb_doc *pfStack_15790;
  undefined1 auStack_15778 [16];
  fdb_kvs_handle *pfStack_15768;
  fdb_doc *pfStack_15760;
  fdb_kvs_handle *pfStack_15758;
  fdb_kvs_handle *pfStack_15750;
  fdb_kvs_handle *pfStack_15748;
  fdb_kvs_config fStack_15740;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_15728;
  filemgr *pfStack_15720;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_15718;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_15710;
  filemgr *pfStack_15708;
  fdb_kvs_handle *pfStack_15700;
  timeval tStack_156f8;
  undefined1 auStack_156e8 [256];
  __atomic_base<unsigned_long> _Stack_155e8;
  timeval tStack_155e0;
  __atomic_base<unsigned_long> _Stack_155d0;
  fdb_doc *apfStack_15588 [32];
  char acStack_15488 [256];
  char acStack_15388 [256];
  fdb_doc afStack_15288 [1000];
  char acStack_1a08 [8];
  fdb_kvs_handle *pfStack_1a00;
  fdb_kvs_handle *pfStack_19f8;
  fdb_kvs_handle *pfStack_19f0;
  fdb_kvs_handle *pfStack_19e8;
  fdb_doc **ppfStack_19e0;
  fdb_doc *pfStack_19d8;
  fdb_kvs_handle *pfStack_19c0;
  fdb_kvs_handle *pfStack_19b8;
  fdb_doc *pfStack_19b0;
  void *pvStack_19a8;
  fdb_kvs_config fStack_19a0;
  undefined1 auStack_1988 [48];
  timeval tStack_1958;
  undefined1 auStack_1948 [760];
  char acStack_1650 [256];
  fdb_doc *apfStack_1550 [101];
  fdb_kvs_handle **ppfStack_1228;
  fdb_kvs_handle *pfStack_1220;
  fdb_kvs_handle *pfStack_1218;
  fdb_kvs_info *pfStack_1210;
  fdb_doc **ppfStack_1208;
  fdb_doc *pfStack_1200;
  undefined1 auStack_11e8 [16];
  undefined1 auStack_11d8 [24];
  undefined1 auStack_11c0 [32];
  fdb_kvs_handle *apfStack_11a0 [5];
  timeval tStack_1178;
  char acStack_1168 [256];
  fdb_doc *apfStack_1068 [31];
  fdb_config fStack_f70;
  fdb_doc afStack_e78 [3];
  char acStack_d78 [256];
  fdb_kvs_info afStack_c78 [5];
  undefined8 auStack_b88 [31];
  fdb_kvs_handle **ppfStack_a90;
  fdb_kvs_handle *pfStack_a88;
  fdb_kvs_handle *pfStack_a80;
  fdb_kvs_config *pfStack_a78;
  fdb_doc **ppfStack_a70;
  fdb_doc *pfStack_a68;
  fdb_kvs_handle *pfStack_a50;
  fdb_kvs_handle *pfStack_a48;
  fdb_doc *pfStack_a40;
  fdb_kvs_handle *pfStack_a38;
  fdb_doc *apfStack_a30 [11];
  timeval tStack_9d8;
  fdb_kvs_config fStack_9c8;
  char acStack_9b0 [256];
  fdb_doc afStack_8b0 [3];
  char acStack_7b0 [256];
  stat sStack_6b0;
  fdb_config fStack_620;
  fdb_kvs_handle **ppfStack_528;
  fdb_kvs_handle *pfStack_520;
  fdb_kvs_handle *pfStack_518;
  btree *pbStack_510;
  fdb_kvs_handle **ppfStack_508;
  fdb_doc *pfStack_500;
  fdb_kvs_handle *local_4f0;
  fdb_kvs_handle *local_4e8;
  fdb_kvs_handle *local_4e0;
  fdb_kvs_handle *local_4d8;
  undefined1 local_4d0 [40];
  undefined1 local_4a8 [40];
  fdb_file_info local_480;
  fdb_kvs_handle local_438;
  char local_138 [264];
  
  pfStack_500 = (fdb_doc *)0x10eb0a;
  gettimeofday((timeval *)(local_4a8 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_500 = (fdb_doc *)0x10eb0f;
  memleak_start();
  pfStack_500 = (fdb_doc *)0x10eb1b;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_500 = (fdb_doc *)0x10eb2b;
  fdb_get_default_config();
  config_00 = (btree *)local_4a8;
  pfStack_500 = (fdb_doc *)0x10eb38;
  fdb_get_default_kvs_config();
  local_438.config.encryption_key.bytes[0xc] = '\0';
  local_438.config.encryption_key.bytes[0xd] = '\0';
  local_438.config.encryption_key.bytes[0xe] = '\0';
  local_438.config.encryption_key.bytes[0xf] = '\x01';
  local_438.config.encryption_key.bytes[0x10] = '\0';
  local_438.config.encryption_key.bytes[0x11] = '\0';
  local_438.config.encryption_key.bytes[0x12] = '\0';
  local_438.config.encryption_key.bytes[0x13] = '\0';
  local_438.config.encryption_key.bytes[0x14] = '\0';
  local_438.config.encryption_key.bytes[0x15] = '\x04';
  local_438.config.encryption_key.bytes[0x16] = '\0';
  local_438.config.encryption_key.bytes[0x17] = '\0';
  local_438.config.encryption_key.bytes[0x18] = '\0';
  local_438.config.encryption_key.bytes[0x19] = '\0';
  local_438.config.encryption_key.bytes[0x1a] = '\0';
  local_438.config.encryption_key.bytes[0x1b] = '\0';
  local_438.config.block_reusing_threshold._4_4_ = 1;
  local_438.config.min_block_reuse_filesize._7_1_ = 0;
  ppfVar7 = &local_4e0;
  pfStack_500 = (fdb_doc *)0x10eb6a;
  fdb_open((fdb_file_handle **)ppfVar7,"./compact_test1",
           (fdb_config *)(local_438.config.encryption_key.bytes + 4));
  ptr_handle = &local_4e8;
  pfStack_500 = (fdb_doc *)0x10eb7d;
  fdb_kvs_open_default((fdb_file_handle *)local_4e0,ptr_handle,(fdb_kvs_config *)config_00);
  pfStack_500 = (fdb_doc *)0x10eb93;
  fVar2 = fdb_set_log_callback(local_4e8,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_500 = (fdb_doc *)0x10ebb7;
    fdb_open((fdb_file_handle **)local_4d0,"./compact_test1",
             (fdb_config *)(local_438.config.encryption_key.bytes + 4));
    ptr_handle = &local_4d8;
    pfStack_500 = (fdb_doc *)0x10ebcc;
    fdb_kvs_open_default((fdb_file_handle *)local_4d0._0_8_,ptr_handle,(fdb_kvs_config *)local_4a8);
    pfStack_500 = (fdb_doc *)0x10ebe2;
    fVar2 = fdb_set_log_callback(local_4d8,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010efd1;
    lVar13 = 0;
    uVar6 = 0;
    do {
      pfStack_500 = (fdb_doc *)0x10ec0a;
      sprintf(local_138,"key%d",uVar6 & 0xffffffff);
      pfStack_500 = (fdb_doc *)0x10ec22;
      sprintf((char *)&local_438.bub_ctx.handle,"meta%d",uVar6 & 0xffffffff);
      pfStack_500 = (fdb_doc *)0x10ec3a;
      sprintf((char *)&local_438,"body%d",uVar6 & 0xffffffff);
      pfStack_500 = (fdb_doc *)0x10ec4a;
      sVar4 = strlen(local_138);
      ppfVar7 = &local_438.bub_ctx.handle;
      pfStack_500 = (fdb_doc *)0x10ec5d;
      sVar5 = strlen((char *)ppfVar7);
      pfStack_500 = (fdb_doc *)0x10ec6d;
      bodylen = strlen((char *)&local_438);
      pfStack_500 = (fdb_doc *)0x10ec92;
      fdb_doc_create((fdb_doc **)(local_4d0 + lVar13 + 8),local_138,sVar4,ppfVar7,sVar5,&local_438,
                     bodylen);
      pfStack_500 = (fdb_doc *)0x10eca1;
      fdb_set(local_4e8,*(fdb_doc **)(local_4d0 + uVar6 * 8 + 8));
      uVar6 = uVar6 + 1;
      lVar13 = lVar13 + 8;
    } while (uVar6 == 1);
    pfStack_500 = (fdb_doc *)0x10ece2;
    fdb_doc_create((fdb_doc **)&local_4f0,*(void **)(local_4d0._16_8_ + 0x20),
                   *(size_t *)local_4d0._16_8_,*(void **)(local_4d0._16_8_ + 0x38),
                   *(size_t *)(local_4d0._16_8_ + 8),(void *)0x0,0);
    *(bool *)&local_4f0->file = true;
    pfStack_500 = (fdb_doc *)0x10ecf3;
    fdb_set(local_4e8,(fdb_doc *)local_4f0);
    pfStack_500 = (fdb_doc *)0x10ecfb;
    fdb_doc_free((fdb_doc *)local_4f0);
    pfStack_500 = (fdb_doc *)0x10ed0a;
    fdb_commit((fdb_file_handle *)local_4e0,'\x01');
    pfStack_500 = (fdb_doc *)0x10ed1b;
    fdb_compact((fdb_file_handle *)local_4e0,"./compact_test2");
    pfStack_500 = (fdb_doc *)0x10ed27;
    system("cp  compact_test1 compact_test11 > errorlog.txt");
    pfStack_500 = (fdb_doc *)0x10ed45;
    sprintf(local_138,"key%d",2);
    ppfVar7 = &local_438.bub_ctx.handle;
    pfStack_500 = (fdb_doc *)0x10ed63;
    sprintf((char *)ppfVar7,"meta%d",2);
    unaff_R12 = &local_438;
    pfStack_500 = (fdb_doc *)0x10ed81;
    sprintf((char *)unaff_R12,"body%d",2);
    pfStack_500 = (fdb_doc *)0x10ed89;
    unaff_R13 = (fdb_kvs_handle *)strlen(local_138);
    pfStack_500 = (fdb_doc *)0x10ed94;
    unaff_RBP = (fdb_doc *)strlen((char *)ppfVar7);
    pfStack_500 = (fdb_doc *)0x10ed9f;
    sVar4 = strlen((char *)unaff_R12);
    pfStack_500 = (fdb_doc *)0x10edba;
    fdb_doc_create((fdb_doc **)(local_4d0 + 0x18),local_138,(size_t)unaff_R13,ppfVar7,
                   (size_t)unaff_RBP,unaff_R12,sVar4);
    pfStack_500 = (fdb_doc *)0x10edc7;
    fdb_set(local_4e8,(fdb_doc *)local_4d0._24_8_);
    pfStack_500 = (fdb_doc *)0x10edd6;
    fdb_commit((fdb_file_handle *)local_4e0,'\x01');
    pfStack_500 = (fdb_doc *)0x10ede0;
    fdb_kvs_close(local_4e8);
    ptr_handle = &local_4d8;
    pfStack_500 = (fdb_doc *)0x10eded;
    fdb_kvs_close(local_4d8);
    pfStack_500 = (fdb_doc *)0x10edf7;
    fdb_close((fdb_file_handle *)local_4e0);
    config_00 = (btree *)local_4d0;
    pfStack_500 = (fdb_doc *)0x10ee04;
    fdb_close((fdb_file_handle *)local_4d0._0_8_);
    pfStack_500 = (fdb_doc *)0x10ee10;
    system("mv  compact_test11 compact_test1 > errorlog.txt");
    pfStack_500 = (fdb_doc *)0x10ee27;
    fdb_open((fdb_file_handle **)config_00,"./compact_test1",
             (fdb_config *)(local_438.config.encryption_key.bytes + 4));
    pfStack_500 = (fdb_doc *)0x10ee37;
    fdb_kvs_open_default((fdb_file_handle *)local_4d0._0_8_,ptr_handle,(fdb_kvs_config *)local_4a8);
    pfStack_500 = (fdb_doc *)0x10ee4d;
    fVar2 = fdb_set_log_callback(local_4d8,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar2 == FDB_RESULT_SUCCESS) {
      unaff_R12 = (fdb_kvs_handle *)0x0;
      ptr_handle = &local_4f0;
      while( true ) {
        pfStack_500 = (fdb_doc *)0x10ee81;
        fdb_doc_create((fdb_doc **)ptr_handle,
                       (void *)(*(size_t **)(local_4d0 + (long)unaff_R12 * 8 + 8))[4],
                       **(size_t **)(local_4d0 + (long)unaff_R12 * 8 + 8),(void *)0x0,0,(void *)0x0,
                       0);
        pfStack_500 = (fdb_doc *)0x10ee90;
        fVar2 = fdb_get(local_4d8,(fdb_doc *)local_4f0);
        pfVar8 = local_4f0;
        if (unaff_R12 != (fdb_kvs_handle *)0x1) break;
        pfVar8 = unaff_R13;
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010efc7;
LAB_0010eef0:
        pfStack_500 = (fdb_doc *)0x10eefa;
        fdb_doc_free((fdb_doc *)local_4f0);
        unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
        unaff_R13 = pfVar8;
        if (unaff_R12 == (fdb_kvs_handle *)0x3) {
          pfStack_500 = (fdb_doc *)0x10ef19;
          fdb_get_file_info((fdb_file_handle *)local_4d0._0_8_,&local_480);
          pfStack_500 = (fdb_doc *)0x10ef28;
          iVar3 = strcmp("./compact_test2",local_480.filename);
          if (iVar3 != 0) {
            pfStack_500 = (fdb_doc *)0x10ef36;
            auto_recover_compact_ok_test();
          }
          pfStack_500 = (fdb_doc *)0x10ef40;
          fdb_kvs_close(local_4d8);
          pfStack_500 = (fdb_doc *)0x10ef4a;
          fdb_close((fdb_file_handle *)local_4d0._0_8_);
          lVar13 = 0;
          do {
            pfStack_500 = (fdb_doc *)0x10ef56;
            fdb_doc_free(*(fdb_doc **)(local_4d0 + lVar13 * 8 + 8));
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          pfStack_500 = (fdb_doc *)0x10ef64;
          fdb_shutdown();
          pfStack_500 = (fdb_doc *)0x10ef69;
          memleak_end();
          pcVar11 = "%s PASSED\n";
          if (auto_recover_compact_ok_test()::__test_pass != '\0') {
            pcVar11 = "%s FAILED\n";
          }
          pfStack_500 = (fdb_doc *)0x10ef9a;
          fprintf(_stderr,pcVar11,"auto recovery after compaction test");
          return;
        }
      }
      if (fVar2 == FDB_RESULT_SUCCESS) {
        config_00 = local_4f0->staletree;
        unaff_RBP = *(fdb_doc **)(local_4d0 + (long)unaff_R12 * 8 + 8);
        ppfVar7 = (fdb_kvs_handle **)unaff_RBP->meta;
        pfStack_500 = (fdb_doc *)0x10eec9;
        iVar3 = bcmp(config_00,ppfVar7,(size_t)(local_4f0->kvs_config).custom_cmp);
        if (iVar3 == 0) {
          config_00 = (pfVar8->field_6).seqtree;
          ppfVar7 = (fdb_kvs_handle **)unaff_RBP->body;
          pfStack_500 = (fdb_doc *)0x10eee8;
          iVar3 = bcmp(config_00,ppfVar7,(size_t)(pfVar8->kvs_config).custom_cmp_param);
          if (iVar3 == 0) goto LAB_0010eef0;
          pfStack_500 = (fdb_doc *)0x10efb7;
          auto_recover_compact_ok_test();
          unaff_R13 = pfVar8;
          goto LAB_0010efb7;
        }
      }
      else {
LAB_0010efb7:
        pfVar8 = unaff_R13;
        pfStack_500 = (fdb_doc *)0x10efbc;
        auto_recover_compact_ok_test();
      }
      pfStack_500 = (fdb_doc *)0x10efc7;
      auto_recover_compact_ok_test();
      unaff_R13 = pfVar8;
LAB_0010efc7:
      pfStack_500 = (fdb_doc *)0x10efcc;
      auto_recover_compact_ok_test();
      goto LAB_0010efcc;
    }
  }
  else {
LAB_0010efcc:
    pfStack_500 = (fdb_doc *)0x10efd1;
    auto_recover_compact_ok_test();
LAB_0010efd1:
    pfStack_500 = (fdb_doc *)0x10efd6;
    auto_recover_compact_ok_test();
  }
  pfStack_500 = (fdb_doc *)unlink_after_compaction_test;
  auto_recover_compact_ok_test();
  pfStack_a68 = (fdb_doc *)0x10effb;
  ppfStack_528 = ptr_handle;
  pfStack_520 = unaff_R12;
  pfStack_518 = unaff_R13;
  pbStack_510 = config_00;
  ppfStack_508 = ppfVar7;
  pfStack_500 = unaff_RBP;
  gettimeofday(&tStack_9d8,(__timezone_ptr_t)0x0);
  pfStack_a68 = (fdb_doc *)0x10f000;
  memleak_start();
  pfStack_a68 = (fdb_doc *)0x10f00c;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_a68 = (fdb_doc *)0x10f01c;
  fdb_get_default_config();
  config = &fStack_9c8;
  pfStack_a68 = (fdb_doc *)0x10f02c;
  fdb_get_default_kvs_config();
  fStack_620.buffercache_size = 0x1000000;
  fStack_620.wal_threshold = 0x400;
  fStack_620.flags = 1;
  fStack_620.compaction_threshold = '\0';
  doc = &pfStack_a40;
  pfStack_a68 = (fdb_doc *)0x10f05e;
  fdb_open((fdb_file_handle **)doc,"./compact_test1",&fStack_620);
  ppfVar7 = &pfStack_a48;
  pfStack_a68 = (fdb_doc *)0x10f071;
  fdb_kvs_open_default((fdb_file_handle *)pfStack_a40,ppfVar7,config);
  pfStack_a68 = (fdb_doc *)0x10f087;
  fVar2 = fdb_set_log_callback(pfStack_a48,logCallbackFunc,"unlink_after_compaction_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (fdb_kvs_handle *)0x0;
    uVar6 = 0;
    do {
      pfStack_a68 = (fdb_doc *)0x10f0af;
      sprintf(acStack_7b0,"key%d",uVar6 & 0xffffffff);
      pfStack_a68 = (fdb_doc *)0x10f0c7;
      sprintf((char *)afStack_8b0,"meta%d",uVar6 & 0xffffffff);
      pfStack_a68 = (fdb_doc *)0x10f0df;
      sprintf(acStack_9b0,"body%d",uVar6 & 0xffffffff);
      doc = (fdb_doc **)((long)apfStack_a30 + (long)unaff_R12);
      pfStack_a68 = (fdb_doc *)0x10f0ef;
      unaff_R13 = (fdb_kvs_handle *)strlen(acStack_7b0);
      unaff_RBP = afStack_8b0;
      pfStack_a68 = (fdb_doc *)0x10f102;
      config = (fdb_kvs_config *)strlen((char *)unaff_RBP);
      pfStack_a68 = (fdb_doc *)0x10f112;
      sVar4 = strlen(acStack_9b0);
      pfStack_a68 = (fdb_doc *)0x10f137;
      fdb_doc_create(doc,acStack_7b0,(size_t)unaff_R13,unaff_RBP,(size_t)config,acStack_9b0,sVar4);
      pfStack_a68 = (fdb_doc *)0x10f146;
      fdb_set(pfStack_a48,apfStack_a30[uVar6]);
      uVar6 = uVar6 + 1;
      unaff_R12 = (fdb_kvs_handle *)((long)unaff_R12 + 8);
    } while (uVar6 != 10);
    pfStack_a68 = (fdb_doc *)0x10f166;
    fdb_commit((fdb_file_handle *)pfStack_a40,'\x01');
    pfStack_a68 = (fdb_doc *)0x10f17a;
    fVar2 = fdb_snapshot_open(pfStack_a48,&pfStack_a38,10);
    ppfVar7 = (fdb_kvs_handle **)0xa;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f2df;
    pfStack_a68 = (fdb_doc *)0x10f193;
    fVar2 = fdb_compact((fdb_file_handle *)pfStack_a40,"./compact_test2");
    if (fVar2 == FDB_RESULT_SUCCESS) {
      config = (fdb_kvs_config *)0x0;
      do {
        pfStack_a68 = (fdb_doc *)0x10f1c7;
        fdb_doc_create((fdb_doc **)&pfStack_a50,apfStack_a30[(long)config]->key,
                       apfStack_a30[(long)config]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_a68 = (fdb_doc *)0x10f1d6;
        fVar2 = fdb_get(pfStack_a48,(fdb_doc *)pfStack_a50);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pfStack_a68 = (fdb_doc *)0x10f2d5;
          unlink_after_compaction_test();
          goto LAB_0010f2d5;
        }
        pfStack_a68 = (fdb_doc *)0x10f1e8;
        fdb_doc_free((fdb_doc *)pfStack_a50);
        config = (fdb_kvs_config *)&config->field_0x1;
      } while (config != (fdb_kvs_config *)0xa);
      pfStack_a68 = (fdb_doc *)0x10f205;
      iVar3 = stat("./compact_test1",&sStack_6b0);
      if (iVar3 == 0) {
        pfStack_a68 = (fdb_doc *)0x10f20e;
        unlink_after_compaction_test();
      }
      config = (fdb_kvs_config *)0x0;
      while( true ) {
        pfStack_a68 = (fdb_doc *)0x10f23a;
        fdb_doc_create((fdb_doc **)&pfStack_a50,apfStack_a30[(long)config]->key,
                       apfStack_a30[(long)config]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_a68 = (fdb_doc *)0x10f249;
        fVar2 = fdb_get(pfStack_a38,(fdb_doc *)pfStack_a50);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_a68 = (fdb_doc *)0x10f25b;
        fdb_doc_free((fdb_doc *)pfStack_a50);
        config = (fdb_kvs_config *)&config->field_0x1;
        if (config == (fdb_kvs_config *)0xa) {
          pfStack_a68 = (fdb_doc *)0x10f26e;
          fdb_close((fdb_file_handle *)pfStack_a40);
          pfStack_a68 = (fdb_doc *)0x10f273;
          fdb_shutdown();
          lVar13 = 0;
          do {
            pfStack_a68 = (fdb_doc *)0x10f27f;
            fdb_doc_free(apfStack_a30[lVar13]);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 10);
          pfStack_a68 = (fdb_doc *)0x10f28d;
          memleak_end();
          pcVar11 = "%s PASSED\n";
          if (unlink_after_compaction_test()::__test_pass != '\0') {
            pcVar11 = "%s FAILED\n";
          }
          pfStack_a68 = (fdb_doc *)0x10f2be;
          fprintf(_stderr,pcVar11,"unlink after compaction test");
          return;
        }
      }
LAB_0010f2d5:
      ppfVar7 = &pfStack_a50;
      pfStack_a68 = (fdb_doc *)0x10f2da;
      unlink_after_compaction_test();
      goto LAB_0010f2da;
    }
  }
  else {
LAB_0010f2da:
    pfStack_a68 = (fdb_doc *)0x10f2df;
    unlink_after_compaction_test();
LAB_0010f2df:
    pfStack_a68 = (fdb_doc *)0x10f2e4;
    unlink_after_compaction_test();
  }
  pfStack_a68 = (fdb_doc *)db_compact_overwrite;
  unlink_after_compaction_test();
  pfStack_1200 = (fdb_doc *)0x10f309;
  ppfStack_a90 = ppfVar7;
  pfStack_a88 = unaff_R12;
  pfStack_a80 = unaff_R13;
  pfStack_a78 = config;
  ppfStack_a70 = doc;
  pfStack_a68 = unaff_RBP;
  gettimeofday(&tStack_1178,(__timezone_ptr_t)0x0);
  pfStack_1200 = (fdb_doc *)0x10f30e;
  memleak_start();
  pfStack_1200 = (fdb_doc *)0x10f31a;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_1200 = (fdb_doc *)0x10f32a;
  fdb_get_default_config();
  info_00 = (fdb_kvs_info *)auStack_11c0;
  pfStack_1200 = (fdb_doc *)0x10f337;
  fdb_get_default_kvs_config();
  fStack_f70.buffercache_size = 0x1000000;
  fStack_f70.wal_threshold = 0x400;
  fStack_f70.flags = 1;
  fStack_f70.compaction_threshold = '\0';
  _Var16._M_i = (__int_type_conflict)(auStack_11d8 + 0x10);
  pfStack_1200 = (fdb_doc *)0x10f369;
  fdb_open((fdb_file_handle **)_Var16._M_i,"./compact_test1",&fStack_f70);
  ppfVar7 = (fdb_kvs_handle **)auStack_11d8;
  pfStack_1200 = (fdb_doc *)0x10f37e;
  fdb_kvs_open((fdb_file_handle *)auStack_11d8._16_8_,ppfVar7,(char *)0x0,(fdb_kvs_config *)info_00)
  ;
  pfStack_1200 = (fdb_doc *)0x10f394;
  pfVar8 = (fdb_kvs_handle *)auStack_11d8._0_8_;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_11d8._0_8_,logCallbackFunc,"db_destroy_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (fdb_kvs_handle *)0x0;
    uVar6 = 0;
    do {
      pfStack_1200 = (fdb_doc *)0x10f3bc;
      sprintf(acStack_d78,"key%d",uVar6 & 0xffffffff);
      pfStack_1200 = (fdb_doc *)0x10f3d4;
      sprintf((char *)afStack_e78,"meta%d",uVar6 & 0xffffffff);
      pfStack_1200 = (fdb_doc *)0x10f3ec;
      sprintf(acStack_1168,"body%d",uVar6 & 0xffffffff);
      _Var16._M_i = (long)apfStack_1068 + (long)unaff_R12;
      pfStack_1200 = (fdb_doc *)0x10f3ff;
      unaff_R13 = (fdb_kvs_handle *)strlen(acStack_d78);
      unaff_RBP = afStack_e78;
      pfStack_1200 = (fdb_doc *)0x10f412;
      info_00 = (fdb_kvs_info *)strlen((char *)unaff_RBP);
      pfStack_1200 = (fdb_doc *)0x10f422;
      sVar4 = strlen(acStack_1168);
      pfStack_1200 = (fdb_doc *)0x10f447;
      fdb_doc_create((fdb_doc **)_Var16._M_i,acStack_d78,(size_t)unaff_R13,unaff_RBP,(size_t)info_00
                     ,acStack_1168,sVar4);
      pfStack_1200 = (fdb_doc *)0x10f459;
      fdb_set((fdb_kvs_handle *)auStack_11d8._0_8_,apfStack_1068[uVar6]);
      uVar6 = uVar6 + 1;
      unaff_R12 = (fdb_kvs_handle *)((long)unaff_R12 + 8);
    } while (uVar6 != 0x1e);
    pfStack_1200 = (fdb_doc *)0x10f476;
    fdb_commit((fdb_file_handle *)auStack_11d8._16_8_,'\0');
    pfStack_1200 = (fdb_doc *)0x10f492;
    fdb_open((fdb_file_handle **)(auStack_11d8 + 8),"./compact_test1.1",&fStack_f70);
    ppfVar7 = (fdb_kvs_handle **)(auStack_11e8 + 8);
    pfStack_1200 = (fdb_doc *)0x10f4a9;
    fdb_kvs_open((fdb_file_handle *)auStack_11d8._8_8_,ppfVar7,(char *)0x0,
                 (fdb_kvs_config *)auStack_11c0);
    pfStack_1200 = (fdb_doc *)0x10f4bf;
    pfVar8 = (fdb_kvs_handle *)auStack_11e8._8_8_;
    fVar2 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_11e8._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f903;
    unaff_R12 = (fdb_kvs_handle *)0x0;
    uVar6 = 0;
    do {
      pfStack_1200 = (fdb_doc *)0x10f4e7;
      sprintf(acStack_d78,"k2ey%d",uVar6 & 0xffffffff);
      pfStack_1200 = (fdb_doc *)0x10f4ff;
      sprintf((char *)afStack_e78,"m2eta%d",uVar6 & 0xffffffff);
      pfStack_1200 = (fdb_doc *)0x10f517;
      sprintf(acStack_1168,"b2ody%d",uVar6 & 0xffffffff);
      _Var16._M_i = (long)unaff_R12 + (long)&afStack_c78[0].name;
      pfStack_1200 = (fdb_doc *)0x10f52a;
      unaff_R13 = (fdb_kvs_handle *)strlen(acStack_d78);
      unaff_RBP = afStack_e78;
      pfStack_1200 = (fdb_doc *)0x10f53d;
      info_00 = (fdb_kvs_info *)strlen((char *)unaff_RBP);
      pfStack_1200 = (fdb_doc *)0x10f54d;
      sVar4 = strlen(acStack_1168);
      pfStack_1200 = (fdb_doc *)0x10f572;
      fdb_doc_create((fdb_doc **)_Var16._M_i,acStack_d78,(size_t)unaff_R13,unaff_RBP,(size_t)info_00
                     ,acStack_1168,sVar4);
      pfStack_1200 = (fdb_doc *)0x10f584;
      fdb_set((fdb_kvs_handle *)auStack_11e8._8_8_,(fdb_doc *)(&afStack_c78[0].name)[uVar6]);
      uVar6 = uVar6 + 1;
      unaff_R12 = (fdb_kvs_handle *)((long)unaff_R12 + 8);
    } while (uVar6 != 0x3c);
    pfStack_1200 = (fdb_doc *)0x10f5a1;
    fdb_commit((fdb_file_handle *)auStack_11d8._8_8_,'\0');
    pfStack_1200 = (fdb_doc *)0x10f5b0;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_11e8._8_8_,(fdb_kvs_info *)(auStack_11c0 + 0x18));
    ppfVar7 = apfStack_11a0;
    if (apfStack_11a0[0] != (fdb_kvs_handle *)0x3c) {
      pfStack_1200 = (fdb_doc *)0x10f5c3;
      db_compact_overwrite();
    }
    pfStack_1200 = (fdb_doc *)0x10f5cd;
    fdb_kvs_close((fdb_kvs_handle *)auStack_11e8._8_8_);
    pfStack_1200 = (fdb_doc *)0x10f5d7;
    fdb_close((fdb_file_handle *)auStack_11d8._8_8_);
    pfStack_1200 = (fdb_doc *)0x10f5e3;
    pfVar8 = (fdb_kvs_handle *)auStack_11d8._16_8_;
    fVar2 = fdb_compact((fdb_file_handle *)auStack_11d8._16_8_,(char *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f908;
    info_00 = (fdb_kvs_info *)auStack_11d8;
    pfStack_1200 = (fdb_doc *)0x10f5f8;
    fdb_kvs_close((fdb_kvs_handle *)auStack_11d8._0_8_);
    _Var16._M_i = (__int_type_conflict)(auStack_11d8 + 0x10);
    pfStack_1200 = (fdb_doc *)0x10f605;
    fdb_close((fdb_file_handle *)auStack_11d8._16_8_);
    pfStack_1200 = (fdb_doc *)0x10f61c;
    fdb_open((fdb_file_handle **)_Var16._M_i,"./compact_test1",&fStack_f70);
    pfStack_1200 = (fdb_doc *)0x10f62e;
    fdb_kvs_open((fdb_file_handle *)auStack_11d8._16_8_,(fdb_kvs_handle **)info_00,(char *)0x0,
                 (fdb_kvs_config *)auStack_11c0);
    pfStack_1200 = (fdb_doc *)0x10f644;
    pfVar8 = (fdb_kvs_handle *)auStack_11d8._0_8_;
    fVar2 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_11d8._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f90d;
    unaff_R12 = (fdb_kvs_handle *)0x0;
    info_00 = (fdb_kvs_info *)auStack_11e8;
    do {
      pfStack_1200 = (fdb_doc *)0x10f67b;
      fdb_doc_create((fdb_doc **)info_00,
                     (void *)(*(size_t **)((long)apfStack_1068 + (long)unaff_R12))[4],
                     **(size_t **)((long)apfStack_1068 + (long)unaff_R12),(void *)0x0,0,(void *)0x0,
                     0);
      pfStack_1200 = (fdb_doc *)0x10f68a;
      pfVar8 = (fdb_kvs_handle *)auStack_11d8._0_8_;
      fVar2 = fdb_get((fdb_kvs_handle *)auStack_11d8._0_8_,(fdb_doc *)auStack_11e8._0_8_);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_1200 = (fdb_doc *)0x10f8f9;
        db_compact_overwrite();
        goto LAB_0010f8f9;
      }
      _Var16._M_i = (long)apfStack_1068 + (long)unaff_R12;
      pfStack_1200 = (fdb_doc *)0x10f6b6;
      iVar3 = bcmp(*(btree **)(auStack_11e8._0_8_ + 0x38),(*(fdb_doc **)_Var16._M_i)->meta,
                   (size_t)((fdb_kvs_config *)auStack_11e8._0_8_)->custom_cmp);
      if (iVar3 != 0) {
        pfStack_1200 = (fdb_doc *)0x10f6ff;
        db_compact_overwrite();
      }
      pfStack_1200 = (fdb_doc *)0x10f6d3;
      iVar3 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_11e8._0_8_ + 0x40))->
                   seqtree,(*(fdb_doc **)_Var16._M_i)->body,
                   (size_t)((fdb_kvs_config *)auStack_11e8._0_8_)->custom_cmp_param);
      if (iVar3 != 0) {
        pfStack_1200 = (fdb_doc *)0x10f70c;
        db_compact_overwrite();
      }
      pfStack_1200 = (fdb_doc *)0x10f6e1;
      fdb_doc_free((fdb_doc *)auStack_11e8._0_8_);
      unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).custom_cmp;
    } while (unaff_R12 != (fdb_kvs_handle *)0xf0);
    pfStack_1200 = (fdb_doc *)0x10f72a;
    fdb_open((fdb_file_handle **)(auStack_11d8 + 8),"./compact_test1.1",&fStack_f70);
    info_00 = (fdb_kvs_info *)(auStack_11e8 + 8);
    pfStack_1200 = (fdb_doc *)0x10f741;
    fdb_kvs_open((fdb_file_handle *)auStack_11d8._8_8_,(fdb_kvs_handle **)info_00,(char *)0x0,
                 (fdb_kvs_config *)auStack_11c0);
    pfStack_1200 = (fdb_doc *)0x10f757;
    pfVar8 = (fdb_kvs_handle *)auStack_11e8._8_8_;
    fVar2 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_11e8._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar2 == FDB_RESULT_SUCCESS) {
      info_00 = (fdb_kvs_info *)(auStack_11c0 + 0x18);
      pfStack_1200 = (fdb_doc *)0x10f771;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_11e8._8_8_,info_00);
      if (apfStack_11a0[0] != (fdb_kvs_handle *)0x3c) {
        pfStack_1200 = (fdb_doc *)0x10f780;
        db_compact_overwrite();
      }
      _Var16._M_i = 0;
      ppfVar7 = (fdb_kvs_handle **)auStack_11e8;
      while( true ) {
        psVar1 = *(size_t **)((long)&afStack_c78[0].name + _Var16._M_i);
        pfStack_1200 = (fdb_doc *)0x10f7af;
        fdb_doc_create((fdb_doc **)ppfVar7,(void *)psVar1[4],*psVar1,(void *)0x0,0,(void *)0x0,0);
        pfStack_1200 = (fdb_doc *)0x10f7be;
        pfVar8 = (fdb_kvs_handle *)auStack_11e8._8_8_;
        fVar2 = fdb_get((fdb_kvs_handle *)auStack_11e8._8_8_,(fdb_doc *)auStack_11e8._0_8_);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        info_00 = (fdb_kvs_info *)((long)&afStack_c78[0].name + _Var16._M_i);
        pfStack_1200 = (fdb_doc *)0x10f7ea;
        iVar3 = bcmp(*(btree **)(auStack_11e8._0_8_ + 0x38),*(void **)(info_00->name + 0x38),
                     (size_t)((fdb_kvs_config *)auStack_11e8._0_8_)->custom_cmp);
        if (iVar3 != 0) {
          pfStack_1200 = (fdb_doc *)0x10f833;
          db_compact_overwrite();
        }
        pfStack_1200 = (fdb_doc *)0x10f807;
        iVar3 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_11e8._0_8_ + 0x40))
                     ->seqtree,*(void **)(info_00->name + 0x40),
                     (size_t)((fdb_kvs_config *)auStack_11e8._0_8_)->custom_cmp_param);
        if (iVar3 != 0) {
          pfStack_1200 = (fdb_doc *)0x10f840;
          db_compact_overwrite();
        }
        pfStack_1200 = (fdb_doc *)0x10f815;
        fdb_doc_free((fdb_doc *)auStack_11e8._0_8_);
        _Var16._M_i = _Var16._M_i + 8;
        if ((fdb_doc **)_Var16._M_i == (fdb_doc **)0x1e0) {
          lVar13 = 0;
          do {
            pfStack_1200 = (fdb_doc *)0x10f851;
            fdb_doc_free(apfStack_1068[lVar13]);
            pfStack_1200 = (fdb_doc *)0x10f85e;
            fdb_doc_free((fdb_doc *)(&afStack_c78[0].name)[lVar13]);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x1e);
          lVar13 = 0;
          do {
            pfStack_1200 = (fdb_doc *)0x10f876;
            fdb_doc_free((fdb_doc *)auStack_b88[lVar13]);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x1e);
          pfStack_1200 = (fdb_doc *)0x10f889;
          fdb_kvs_close((fdb_kvs_handle *)auStack_11d8._0_8_);
          pfStack_1200 = (fdb_doc *)0x10f893;
          fdb_close((fdb_file_handle *)auStack_11d8._16_8_);
          pfStack_1200 = (fdb_doc *)0x10f89d;
          fdb_kvs_close((fdb_kvs_handle *)auStack_11e8._8_8_);
          pfStack_1200 = (fdb_doc *)0x10f8a7;
          fdb_close((fdb_file_handle *)auStack_11d8._8_8_);
          pfStack_1200 = (fdb_doc *)0x10f8ac;
          fdb_shutdown();
          pfStack_1200 = (fdb_doc *)0x10f8b1;
          memleak_end();
          pcVar11 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar11 = "%s FAILED\n";
          }
          pfStack_1200 = (fdb_doc *)0x10f8e2;
          fprintf(_stderr,pcVar11,"compact overwrite");
          return;
        }
      }
LAB_0010f8f9:
      pfStack_1200 = (fdb_doc *)0x10f8fe;
      db_compact_overwrite();
      goto LAB_0010f8fe;
    }
  }
  else {
LAB_0010f8fe:
    pfStack_1200 = (fdb_doc *)0x10f903;
    db_compact_overwrite();
LAB_0010f903:
    pfStack_1200 = (fdb_doc *)0x10f908;
    db_compact_overwrite();
LAB_0010f908:
    pfStack_1200 = (fdb_doc *)0x10f90d;
    db_compact_overwrite();
LAB_0010f90d:
    pfStack_1200 = (fdb_doc *)0x10f912;
    db_compact_overwrite();
  }
  pfStack_1200 = (fdb_doc *)db_compact_during_doc_delete;
  db_compact_overwrite();
  pfStack_19d8 = (fdb_doc *)0x10f937;
  ppfStack_1228 = ppfVar7;
  pfStack_1220 = unaff_R12;
  pfStack_1218 = unaff_R13;
  pfStack_1210 = info_00;
  ppfStack_1208 = (fdb_doc **)_Var16._M_i;
  pfStack_1200 = unaff_RBP;
  gettimeofday(&tStack_1958,(__timezone_ptr_t)0x0);
  pfStack_19d8 = (fdb_doc *)0x10f93c;
  memleak_start();
  pfStack_19d8 = (fdb_doc *)0x10f946;
  fdb_get_default_kvs_config();
  ptr_fhandle_00 = (fdb_kvs_handle *)auStack_1948;
  pfStack_19d8 = (fdb_doc *)0x10f956;
  fdb_get_default_config();
  auStack_1948._8_8_ = (list *)0x0;
  auStack_1948._16_8_ = (list *)0x400;
  auStack_1948[0x2f] = '\0';
  if (pfVar8 == (fdb_kvs_handle *)0x0) {
    pfStack_19d8 = (fdb_doc *)0x10f980;
    system("rm -rf  compact_test* > errorlog.txt");
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_19c0;
    pfStack_19d8 = (fdb_doc *)0x10f999;
    fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_1948);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_19d8 = (fdb_doc *)0x10f9b5;
      ptr_fhandle = pfStack_19c0;
      fVar2 = fdb_kvs_open_default((fdb_file_handle *)pfStack_19c0,&pfStack_19b8,&fStack_19a0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fc6b;
      lVar13 = 0;
      uVar6 = 0;
      do {
        pfStack_19d8 = (fdb_doc *)0x10f9dd;
        sprintf(acStack_1650,"key%d",uVar6 & 0xffffffff);
        pfStack_19d8 = (fdb_doc *)0x10f9f5;
        sprintf(auStack_1948 + 0x1f8,"meta%d",uVar6 & 0xffffffff);
        pfStack_19d8 = (fdb_doc *)0x10fa0d;
        sprintf(auStack_1948 + 0xf8,"body%d",uVar6 & 0xffffffff);
        pfStack_19d8 = (fdb_doc *)0x10fa20;
        unaff_R13 = (fdb_kvs_handle *)strlen(acStack_1650);
        unaff_RBP = (fdb_doc *)(auStack_1948 + 0x1f8);
        pfStack_19d8 = (fdb_doc *)0x10fa33;
        sVar4 = strlen((char *)unaff_RBP);
        pfStack_19d8 = (fdb_doc *)0x10fa43;
        sVar5 = strlen(auStack_1948 + 0xf8);
        pfStack_19d8 = (fdb_doc *)0x10fa68;
        fdb_doc_create((fdb_doc **)((long)apfStack_1550 + lVar13),acStack_1650,(size_t)unaff_R13,
                       unaff_RBP,sVar4,auStack_1948 + 0xf8,sVar5);
        pfStack_19d8 = (fdb_doc *)0x10fa7a;
        fdb_set(pfStack_19b8,apfStack_1550[uVar6]);
        uVar6 = uVar6 + 1;
        lVar13 = lVar13 + 8;
      } while (uVar6 != 100);
      pfStack_19d8 = (fdb_doc *)0x10fa97;
      fdb_commit((fdb_file_handle *)pfStack_19c0,'\0');
      pfStack_19d8 = (fdb_doc *)0x10faa6;
      fdb_get_kvs_info(pfStack_19b8,(fdb_kvs_info *)auStack_1988);
      pfVar8 = (fdb_kvs_handle *)(auStack_1988 + 0x10);
      if ((filemgr *)auStack_1988._16_8_ != (filemgr *)0x64) {
        pfStack_19d8 = (fdb_doc *)0x10fab9;
        db_compact_during_doc_delete();
      }
      lVar13 = 0;
      _Var16._M_i = (__int_type_conflict)&pfStack_19b0;
      do {
        pfStack_19d8 = (fdb_doc *)0x10fada;
        fdb_del(pfStack_19b8,apfStack_1550[lVar13]);
        if (lVar13 == 0x32) {
          pfStack_19d8 = (fdb_doc *)0x10faf2;
          pthread_create((pthread_t *)_Var16._M_i,(pthread_attr_t *)0x0,db_compact_during_doc_delete
                         ,pfStack_19c0);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 100);
      pfStack_19d8 = (fdb_doc *)0x10fb0a;
      pthread_join((pthread_t)pfStack_19b0,&pvStack_19a8);
      pfStack_19d8 = (fdb_doc *)0x10fb19;
      fdb_commit((fdb_file_handle *)pfStack_19c0,'\x01');
      pfStack_19d8 = (fdb_doc *)0x10fb2b;
      fdb_get_kvs_info(pfStack_19b8,(fdb_kvs_info *)auStack_1988);
      if ((filemgr *)auStack_1988._16_8_ != (filemgr *)0x0) {
        pfStack_19d8 = (fdb_doc *)0x10fb3a;
        db_compact_during_doc_delete();
      }
      pfStack_19d8 = (fdb_doc *)0x10fb44;
      fdb_kvs_close(pfStack_19b8);
      ptr_fhandle_00 = (fdb_kvs_handle *)&pfStack_19c0;
      pfStack_19d8 = (fdb_doc *)0x10fb51;
      fdb_close((fdb_file_handle *)pfStack_19c0);
      pfStack_19d8 = (fdb_doc *)0x10fb68;
      ptr_fhandle = ptr_fhandle_00;
      fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle_00,"./compact_test1",
                       (fdb_config *)auStack_1948);
      unaff_R12 = (fdb_kvs_handle *)0x64;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fc70;
      pfStack_19d8 = (fdb_doc *)0x10fb84;
      ptr_fhandle = pfStack_19c0;
      fVar2 = fdb_kvs_open_default((fdb_file_handle *)pfStack_19c0,&pfStack_19b8,&fStack_19a0);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pfStack_19d8 = (fdb_doc *)0x10fb9e;
        fdb_get_kvs_info(pfStack_19b8,(fdb_kvs_info *)auStack_1988);
        if ((filemgr *)auStack_1988._16_8_ != (filemgr *)0x0) {
          pfStack_19d8 = (fdb_doc *)0x10fbad;
          db_compact_during_doc_delete();
        }
        lVar13 = 0;
        do {
          pfStack_19d8 = (fdb_doc *)0x10fbbc;
          fdb_doc_free(apfStack_1550[lVar13]);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 100);
        pfStack_19d8 = (fdb_doc *)0x10fbcf;
        fdb_kvs_close(pfStack_19b8);
        pfStack_19d8 = (fdb_doc *)0x10fbd9;
        fdb_close((fdb_file_handle *)pfStack_19c0);
        pfStack_19d8 = (fdb_doc *)0x10fbde;
        fdb_shutdown();
        pfStack_19d8 = (fdb_doc *)0x10fbe3;
        memleak_end();
        pcVar11 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar11 = "%s FAILED\n";
        }
        pfStack_19d8 = (fdb_doc *)0x10fc14;
        fprintf(_stderr,pcVar11,"multi thread client shutdown");
        return;
      }
    }
    else {
      pfStack_19d8 = (fdb_doc *)0x10fc6b;
      db_compact_during_doc_delete();
LAB_0010fc6b:
      pfStack_19d8 = (fdb_doc *)0x10fc70;
      db_compact_during_doc_delete();
LAB_0010fc70:
      pfStack_19d8 = (fdb_doc *)0x10fc75;
      db_compact_during_doc_delete();
    }
    pfStack_19d8 = (fdb_doc *)0x10fc7a;
    db_compact_during_doc_delete();
LAB_0010fc7a:
    pfStack_19d8 = (fdb_doc *)0x10fc7f;
    db_compact_during_doc_delete();
  }
  else {
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_19c0;
    pfStack_19d8 = (fdb_doc *)0x10fc41;
    fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_1948);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fc7a;
    pfStack_19d8 = (fdb_doc *)0x10fc51;
    ptr_fhandle = pfStack_19c0;
    fVar2 = fdb_compact((fdb_file_handle *)pfStack_19c0,(char *)0x0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_19d8 = (fdb_doc *)0x10fc5f;
      fdb_close((fdb_file_handle *)pfStack_19c0);
      pfStack_19d8 = (fdb_doc *)0x10fc66;
      pthread_exit((void *)0x0);
    }
  }
  pfStack_19d8 = (fdb_doc *)compaction_daemon_test;
  db_compact_during_doc_delete();
  pcVar9 = (char *)0x0;
  pfStack_15790 = (fdb_doc *)0x10fcab;
  pfStack_15748 = ptr_fhandle;
  pfStack_1a00 = pfVar8;
  pfStack_19f8 = unaff_R12;
  pfStack_19f0 = unaff_R13;
  pfStack_19e8 = ptr_fhandle_00;
  ppfStack_19e0 = (fdb_doc **)_Var16._M_i;
  pfStack_19d8 = unaff_RBP;
  gettimeofday(&tStack_155e0,(__timezone_ptr_t)0x0);
  pfStack_15790 = (fdb_doc *)0x10fcb0;
  memleak_start();
  pfStack_15790 = (fdb_doc *)0x10fcbc;
  system("rm -rf  compact_test* > errorlog.txt");
  pfVar8 = (fdb_kvs_handle *)auStack_156e8;
  pfStack_15790 = (fdb_doc *)0x10fccc;
  fdb_get_default_config();
  pfStack_15790 = (fdb_doc *)0x10fcd6;
  fdb_get_default_kvs_config();
  auStack_156e8._8_8_ = (kvs_ops_stat *)0x0;
  auStack_156e8._16_8_ = (fdb_file_handle *)0x400;
  auStack_156e8._36_4_ = 1;
  auStack_156e8._46_2_ = 0x1e01;
  auStack_156e8._56_8_ = (docio_handle *)0x1;
  auStack_156e8._120_8_ = 0;
  pcVar11 = auStack_15778;
  pfStack_15790 = (fdb_doc *)0x10fd11;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test",(fdb_config *)pfVar8);
  if (fVar2 != FDB_RESULT_INVALID_CONFIG) goto LAB_0011080b;
  auStack_156e8._120_8_ = 4;
  pfStack_15790 = (fdb_doc *)0x10fd3e;
  fdb_open((fdb_file_handle **)auStack_15778,"compact_test",(fdb_config *)auStack_156e8);
  pfVar8 = (fdb_kvs_handle *)(auStack_15778 + 8);
  pfStack_15790 = (fdb_doc *)0x10fd53;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_15778._0_8_,(fdb_kvs_handle **)pfVar8,&fStack_15740);
  pfStack_15790 = (fdb_doc *)0x10fd69;
  pcVar11 = (char *)auStack_15778._8_8_;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_15778._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110810;
  pfStack_15790 = (fdb_doc *)0x10fd7d;
  puts("Initialize..");
  pcVar9 = (char *)0x0;
  uVar6 = 0;
  do {
    pfStack_15790 = (fdb_doc *)0x10fd9e;
    sprintf((char *)apfStack_15588,"key%04d",uVar6 & 0xffffffff);
    pfStack_15790 = (fdb_doc *)0x10fdba;
    sprintf(acStack_15488,"meta%04d",uVar6 & 0xffffffff);
    pfStack_15790 = (fdb_doc *)0x10fdd6;
    sprintf(acStack_15388,"body%04d",uVar6 & 0xffffffff);
    unaff_RBP = (fdb_doc *)((long)&afStack_15288[0].keylen + (long)pcVar9);
    pfStack_15790 = (fdb_doc *)0x10fde9;
    sVar4 = strlen((char *)apfStack_15588);
    _Var16._M_i = sVar4 + 1;
    pfStack_15790 = (fdb_doc *)0x10fdf5;
    sVar4 = strlen(acStack_15488);
    unaff_R13 = (fdb_kvs_handle *)(sVar4 + 1);
    pfStack_15790 = (fdb_doc *)0x10fe01;
    sVar4 = strlen(acStack_15388);
    pfStack_15790 = (fdb_doc *)0x10fe29;
    fdb_doc_create((fdb_doc **)unaff_RBP,apfStack_15588,_Var16._M_i,acStack_15488,(size_t)unaff_R13,
                   acStack_15388,sVar4 + 1);
    pfStack_15790 = (fdb_doc *)0x10fe3b;
    fdb_set((fdb_kvs_handle *)auStack_15778._8_8_,(fdb_doc *)(&afStack_15288[0].keylen)[uVar6]);
    uVar6 = uVar6 + 1;
    pcVar9 = (char *)((long)pcVar9 + 8);
  } while (uVar6 != 10000);
  pfVar8 = (fdb_kvs_handle *)auStack_15778;
  pfStack_15790 = (fdb_doc *)0x10fe5e;
  fdb_commit((fdb_file_handle *)auStack_15778._0_8_,'\0');
  pfStack_15790 = (fdb_doc *)0x10fe66;
  fdb_close((fdb_file_handle *)auStack_15778._0_8_);
  pfStack_15790 = (fdb_doc *)0x10fe7d;
  pcVar11 = (char *)pfVar8;
  fVar2 = fdb_open((fdb_file_handle **)pfVar8,"compact_test",(fdb_config *)auStack_156e8);
  unaff_R12 = (fdb_kvs_handle *)0x2710;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110815;
  pfStack_15790 = (fdb_doc *)0x10fe99;
  pcVar11 = (char *)auStack_15778._0_8_;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_15778._0_8_,(fdb_kvs_handle **)(auStack_15778 + 8),
                     &fStack_15740);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011081a;
  pfStack_15790 = (fdb_doc *)0x10feb9;
  pcVar11 = (char *)auStack_15778._8_8_;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_15778._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011081f;
  pfVar8 = (fdb_kvs_handle *)&_Stack_155d0;
  pfStack_15790 = (fdb_doc *)0x10fed6;
  fdb_get_file_info((fdb_file_handle *)auStack_15778._0_8_,(fdb_file_info *)pfVar8);
  pfStack_15790 = (fdb_doc *)0x10fee5;
  iVar3 = strcmp((char *)_Stack_155d0._M_i,"compact_test");
  if (iVar3 != 0) {
    pfStack_15790 = (fdb_doc *)0x10fef6;
    compaction_daemon_test();
  }
  pcVar9 = "key%04d";
  _Var16._M_i = (__int_type_conflict)apfStack_15588;
  unaff_R13 = (fdb_kvs_handle *)0x0;
  pfVar10 = unaff_RBP;
  do {
    pfStack_15790 = (fdb_doc *)0x10ff18;
    sprintf((char *)_Var16._M_i,"key%04d",(ulong)unaff_R13 & 0xffffffff);
    pfStack_15790 = (fdb_doc *)0x10ff20;
    sVar4 = strlen((char *)_Var16._M_i);
    pfStack_15790 = (fdb_doc *)0x10ff41;
    fdb_doc_create(&pfStack_15760,(void *)_Var16._M_i,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_15790 = (fdb_doc *)0x10ff50;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_15778._8_8_,pfStack_15760);
    unaff_RBP = pfStack_15760;
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_001107e6:
      pfStack_15790 = (fdb_doc *)0x1107eb;
      compaction_daemon_test();
      goto LAB_001107eb;
    }
    pfVar8 = (fdb_kvs_handle *)pfStack_15760->body;
    unaff_R12 = *(fdb_kvs_handle **)((&afStack_15288[0].keylen)[(long)unaff_R13] + 0x40);
    pfStack_15790 = (fdb_doc *)0x10ff7c;
    iVar3 = bcmp(pfVar8,unaff_R12,pfStack_15760->bodylen);
    pfVar10 = unaff_RBP;
    if (iVar3 != 0) {
      pfStack_15790 = (fdb_doc *)0x1107e6;
      compaction_daemon_test();
      goto LAB_001107e6;
    }
    pfStack_15790 = (fdb_doc *)0x10ff8c;
    fdb_doc_free(unaff_RBP);
    unaff_R13 = (fdb_kvs_handle *)&(unaff_R13->kvs_config).field_0x1;
  } while (unaff_R13 != (fdb_kvs_handle *)0x2710);
  pfStack_15790 = (fdb_doc *)0x10ffb0;
  pcVar11 = (char *)auStack_15778._8_8_;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)auStack_15778._8_8_,(fdb_kvs_handle **)&pfStack_15720,
                            10000);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110824;
  pfStack_15790 = (fdb_doc *)0x10ffc2;
  fdb_kvs_close((fdb_kvs_handle *)pfStack_15720);
  pfVar8 = (fdb_kvs_handle *)auStack_15778;
  pfStack_15790 = (fdb_doc *)0x10ffcf;
  fdb_close((fdb_file_handle *)auStack_15778._0_8_);
  pfStack_15790 = (fdb_doc *)0x10ffdb;
  system("rm -rf  compact_test.meta > errorlog.txt");
  pfStack_15790 = (fdb_doc *)0x10fff2;
  pcVar11 = (char *)pfVar8;
  fVar2 = fdb_open((fdb_file_handle **)pfVar8,"compact_test",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110829;
  pfStack_15790 = (fdb_doc *)0x11000e;
  pcVar11 = (char *)auStack_15778._0_8_;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_15778._0_8_,(fdb_kvs_handle **)(auStack_15778 + 8),
                     &fStack_15740);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011082e;
  pfStack_15790 = (fdb_doc *)0x11002e;
  pcVar11 = (char *)auStack_15778._8_8_;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_15778._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110833;
  pcVar9 = "key%04d";
  _Var16._M_i = (__int_type_conflict)apfStack_15588;
  unaff_R13 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_15790 = (fdb_doc *)0x110058;
    sprintf((char *)_Var16._M_i,"key%04d",(ulong)unaff_R13 & 0xffffffff);
    pfStack_15790 = (fdb_doc *)0x110060;
    sVar4 = strlen((char *)_Var16._M_i);
    pfStack_15790 = (fdb_doc *)0x110081;
    fdb_doc_create(&pfStack_15760,(void *)_Var16._M_i,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_15790 = (fdb_doc *)0x110090;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_15778._8_8_,pfStack_15760);
    pfVar10 = pfStack_15760;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001107f6;
    pfVar8 = (fdb_kvs_handle *)pfStack_15760->body;
    unaff_R12 = *(fdb_kvs_handle **)((&afStack_15288[0].keylen)[(long)unaff_R13] + 0x40);
    pfStack_15790 = (fdb_doc *)0x1100bc;
    iVar3 = bcmp(pfVar8,unaff_R12,pfStack_15760->bodylen);
    if (iVar3 != 0) goto LAB_001107eb;
    pfStack_15790 = (fdb_doc *)0x1100cc;
    fdb_doc_free(pfVar10);
    unaff_R13 = (fdb_kvs_handle *)&(unaff_R13->kvs_config).field_0x1;
    unaff_RBP = pfVar10;
  } while (unaff_R13 != (fdb_kvs_handle *)0x2710);
  pfVar8 = (fdb_kvs_handle *)auStack_15778;
  pfStack_15790 = (fdb_doc *)0x1100e9;
  fdb_close((fdb_file_handle *)auStack_15778._0_8_);
  pfStack_15790 = (fdb_doc *)0x1100f5;
  system("mv  compact_test.0 compact_test.23 > errorlog.txt");
  pfStack_15790 = (fdb_doc *)0x11010c;
  pcVar11 = (char *)pfVar8;
  fVar2 = fdb_open((fdb_file_handle **)pfVar8,"compact_test",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110838;
  pfStack_15790 = (fdb_doc *)0x110128;
  pcVar11 = (char *)auStack_15778._0_8_;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_15778._0_8_,(fdb_kvs_handle **)(auStack_15778 + 8),
                     &fStack_15740);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011083d;
  pfStack_15790 = (fdb_doc *)0x110148;
  pcVar11 = (char *)auStack_15778._8_8_;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_15778._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110842;
  pcVar9 = "key%04d";
  _Var16._M_i = (__int_type_conflict)apfStack_15588;
  unaff_R13 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_15790 = (fdb_doc *)0x110172;
    sprintf((char *)_Var16._M_i,"key%04d",(ulong)unaff_R13 & 0xffffffff);
    pfStack_15790 = (fdb_doc *)0x11017a;
    sVar4 = strlen((char *)_Var16._M_i);
    pfStack_15790 = (fdb_doc *)0x11019b;
    fdb_doc_create(&pfStack_15760,(void *)_Var16._M_i,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_15790 = (fdb_doc *)0x1101aa;
    pcVar11 = (char *)auStack_15778._8_8_;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_15778._8_8_,pfStack_15760);
    pfVar10 = pfStack_15760;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110806;
    pfVar8 = (fdb_kvs_handle *)pfStack_15760->body;
    unaff_R12 = *(fdb_kvs_handle **)((&afStack_15288[0].keylen)[(long)unaff_R13] + 0x40);
    pfStack_15790 = (fdb_doc *)0x1101d6;
    iVar3 = bcmp(pfVar8,unaff_R12,pfStack_15760->bodylen);
    if (iVar3 != 0) goto LAB_001107fb;
    pfStack_15790 = (fdb_doc *)0x1101e6;
    fdb_doc_free(pfVar10);
    unaff_R13 = (fdb_kvs_handle *)&(unaff_R13->kvs_config).field_0x1;
    unaff_RBP = pfVar10;
  } while (unaff_R13 != (fdb_kvs_handle *)0x2710);
  pfStack_15790 = (fdb_doc *)0x110200;
  fdb_close((fdb_file_handle *)auStack_15778._0_8_);
  pcVar11 = (char *)&pfStack_15750;
  pfStack_15790 = (fdb_doc *)0x110219;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_less",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110847;
  pfStack_15790 = (fdb_doc *)0x110238;
  pcVar11 = (char *)pfStack_15750;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfStack_15750,(fdb_kvs_handle **)&pfStack_15708,
                     &fStack_15740);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011084c;
  auStack_156e8._46_2_ = auStack_156e8._46_2_ & 0xff;
  pcVar11 = (char *)&pfStack_15758;
  pfStack_15790 = (fdb_doc *)0x11025d;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_non",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110851;
  pfStack_15790 = (fdb_doc *)0x110279;
  pcVar11 = (char *)pfStack_15758;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfStack_15758,(fdb_kvs_handle **)&aStack_15710.seqtree,
                     &fStack_15740);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110856;
  auStack_156e8._46_2_ = auStack_156e8._46_2_ & 0xff00;
  pcVar11 = (char *)&pfStack_15768;
  pfStack_15790 = (fdb_doc *)0x11029e;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_manual",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011085b;
  pfStack_15790 = (fdb_doc *)0x1102ba;
  pcVar11 = (char *)pfStack_15768;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfStack_15768,(fdb_kvs_handle **)&aStack_15718.seqtree,
                     &fStack_15740);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110860;
  auStack_156e8._46_2_ = 0x1e01;
  pcVar11 = auStack_15778;
  pfStack_15790 = (fdb_doc *)0x1102e1;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110865;
  pfStack_15790 = (fdb_doc *)0x1102fd;
  pcVar11 = (char *)auStack_15778._0_8_;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_15778._0_8_,(fdb_kvs_handle **)(auStack_15778 + 8),
                     &fStack_15740);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011086a;
  pfStack_15790 = (fdb_doc *)0x11031d;
  pcVar11 = (char *)auStack_15778._8_8_;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_15778._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011086f;
  pcVar9 = (char *)0x0;
  pfStack_15790 = (fdb_doc *)0x11033a;
  printf("wait for %d seconds..\n");
  pfStack_15790 = (fdb_doc *)0x11034c;
  gettimeofday((timeval *)(auStack_156e8 + 0xf8),(__timezone_ptr_t)0x0);
  tVar18.tv_usec = _Stack_155e8._M_i;
  tVar18.tv_sec = auStack_156e8._248_8_;
  do {
    pfVar10 = (fdb_doc *)0xfffffffffffec780;
    unaff_R13 = (fdb_kvs_handle *)0x0;
    iVar3 = 0;
    aStack_15728 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar9;
    do {
      pfStack_15790 = (fdb_doc *)0x110388;
      fdb_set((fdb_kvs_handle *)auStack_15778._8_8_,*(fdb_doc **)(acStack_1a08 + (long)pfVar10));
      pfStack_15790 = (fdb_doc *)0x110394;
      fdb_commit((fdb_file_handle *)auStack_15778._0_8_,'\0');
      uVar12 = (int)((ulong)unaff_R13 / 100) * 100 + iVar3;
      unaff_R12 = (fdb_kvs_handle *)(ulong)uVar12;
      if (uVar12 == 0) {
        pfStack_15790 = (fdb_doc *)0x1103ae;
        fdb_set((fdb_kvs_handle *)pfStack_15708,*(fdb_doc **)(acStack_1a08 + (long)pfVar10));
        pfStack_15790 = (fdb_doc *)0x1103ba;
        fdb_commit((fdb_file_handle *)pfStack_15750,'\0');
      }
      pfStack_15790 = (fdb_doc *)0x1103cc;
      fdb_set((fdb_kvs_handle *)aStack_15710.seqtree,*(fdb_doc **)(acStack_1a08 + (long)pfVar10));
      pfStack_15790 = (fdb_doc *)0x1103d8;
      fdb_commit((fdb_file_handle *)pfStack_15758,'\0');
      pfStack_15790 = (fdb_doc *)0x1103ea;
      fdb_set((fdb_kvs_handle *)aStack_15718.seqtree,*(fdb_doc **)(acStack_1a08 + (long)pfVar10));
      pfStack_15790 = (fdb_doc *)0x1103f6;
      fdb_commit((fdb_file_handle *)pfStack_15768,'\0');
      pfStack_15790 = (fdb_doc *)0x110405;
      gettimeofday((timeval *)&tStack_156f8,(__timezone_ptr_t)0x0);
      pfStack_15790 = (fdb_doc *)0x110420;
      tVar17 = _utime_gap(tVar18,tStack_156f8);
      if (pfStack_15748 <= (fdb_kvs_handle *)tVar17.tv_sec) {
        pcVar9 = (char *)(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
        break;
      }
      iVar3 = iVar3 + -1;
      unaff_R13 = (fdb_kvs_handle *)(ulong)((int)unaff_R13 + 1);
      pfVar10 = (fdb_doc *)&pfVar10->metalen;
      pcVar9 = (char *)aStack_15728;
    } while (pfVar10 != (fdb_doc *)0x0);
  } while ((int)pcVar9 == 0);
  pfStack_15790 = (fdb_doc *)0x110459;
  pcVar11 = (char *)auStack_15778._0_8_;
  fVar2 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_15778._0_8_,0x3c);
  pfVar8 = (fdb_kvs_handle *)auStack_156e8._248_8_;
  _Var16._M_i = _Stack_155e8._M_i;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110874;
  pfStack_15790 = (fdb_doc *)0x110470;
  pcVar11 = (char *)auStack_15778._0_8_;
  fVar2 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_15778._0_8_,1);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110879;
  pfStack_15790 = (fdb_doc *)0x110484;
  pcVar11 = (char *)pfStack_15758;
  fVar2 = fdb_compact((fdb_file_handle *)pfStack_15758,(char *)0x0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011087e;
  pfStack_15790 = (fdb_doc *)0x11049d;
  pcVar11 = (char *)pfStack_15768;
  fVar2 = fdb_compact((fdb_file_handle *)pfStack_15768,"compact_test_manual_compacted");
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110883;
  auStack_156e8._46_2_ = auStack_156e8._46_2_ & 0xff00;
  pcVar11 = (char *)&pfStack_15700;
  pfStack_15790 = (fdb_doc *)0x1104c5;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_manual_compacted",
                   (fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110888;
  pfStack_15790 = (fdb_doc *)0x1104e1;
  pcVar11 = (char *)pfStack_15768;
  fVar2 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_15768,'\x01',0x1e);
  if (fVar2 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011088d;
  pfStack_15790 = (fdb_doc *)0x1104f7;
  fVar2 = fdb_close((fdb_file_handle *)pfStack_15700);
  pcVar11 = (char *)pfStack_15700;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110892;
  pfStack_15790 = (fdb_doc *)0x110513;
  pcVar11 = (char *)pfStack_15768;
  fVar2 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_15768,'\x01',10);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110897;
  pfStack_15790 = (fdb_doc *)0x11052f;
  pcVar11 = (char *)pfStack_15768;
  fVar2 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_15768,'\x01',0x1e);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011089c;
  pfStack_15790 = (fdb_doc *)0x110541;
  pcVar11 = (char *)pfStack_15768;
  fVar2 = fdb_close((fdb_file_handle *)pfStack_15768);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108a1;
  auStack_156e8[0x2e] = 1;
  pcVar11 = (char *)&pfStack_15768;
  pfStack_15790 = (fdb_doc *)0x110566;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_manual_compacted",
                   (fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108a6;
  pfStack_15790 = (fdb_doc *)0x11057c;
  pcVar11 = (char *)pfStack_15758;
  fVar2 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_15758,'\0',0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108ab;
  pfStack_15790 = (fdb_doc *)0x11058e;
  pcVar11 = (char *)pfStack_15758;
  fVar2 = fdb_close((fdb_file_handle *)pfStack_15758);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108b0;
  auStack_156e8._46_2_ = auStack_156e8._46_2_ & 0xff00;
  pcVar11 = (char *)&pfStack_15758;
  pfStack_15790 = (fdb_doc *)0x1105b3;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_non",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108b5;
  pcVar9 = "compact_test_non.manual";
  pfStack_15790 = (fdb_doc *)0x1105cf;
  fdb_compact((fdb_file_handle *)pfStack_15758,"compact_test_non.manual");
  pfVar8 = (fdb_kvs_handle *)auStack_15778;
  pfStack_15790 = (fdb_doc *)0x1105dc;
  fdb_close((fdb_file_handle *)auStack_15778._0_8_);
  pfStack_15790 = (fdb_doc *)0x1105e6;
  fdb_close((fdb_file_handle *)pfStack_15750);
  pfStack_15790 = (fdb_doc *)0x1105f0;
  fdb_close((fdb_file_handle *)pfStack_15768);
  auStack_156e8[0x2e] = 1;
  pfStack_15790 = (fdb_doc *)0x110607;
  pcVar11 = (char *)pfVar8;
  fVar2 = fdb_open((fdb_file_handle **)pfVar8,"compact_test_non.manual",(fdb_config *)auStack_156e8)
  ;
  if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108ba;
  pcVar11 = "compact_test_non.manual";
  pfStack_15790 = (fdb_doc *)0x110624;
  fVar2 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108bf;
  auStack_156e8._46_2_ = auStack_156e8._46_2_ & 0xff00;
  pcVar11 = auStack_15778;
  pfStack_15790 = (fdb_doc *)0x11064a;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_manual_compacted",
                   (fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c4;
  pcVar11 = "compact_test_manual_compacted";
  pfStack_15790 = (fdb_doc *)0x110667;
  fVar2 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c9;
  auStack_156e8[0x2e] = 1;
  pcVar11 = "compact_test_manual_compacted";
  pfStack_15790 = (fdb_doc *)0x110688;
  fVar2 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108ce;
  auStack_156e8._46_2_ = auStack_156e8._46_2_ & 0xff00;
  pcVar11 = "compact_test_non.manual";
  pfStack_15790 = (fdb_doc *)0x1106a8;
  fVar2 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_FILE_IS_BUSY) goto LAB_001108d3;
  pfStack_15790 = (fdb_doc *)0x1106bb;
  fdb_close((fdb_file_handle *)pfStack_15758);
  pfStack_15790 = (fdb_doc *)0x1106c0;
  fVar2 = fdb_shutdown();
  pcVar11 = (char *)pfStack_15758;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d8;
  pcVar11 = "compact_test_non.manual";
  pfStack_15790 = (fdb_doc *)0x1106dc;
  fVar2 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108dd;
  auStack_156e8._36_4_ = 2;
  pcVar11 = auStack_15778;
  pfStack_15790 = (fdb_doc *)0x110704;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"./compact_test_manual_compacted",
                   (fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e2;
  pcVar11 = auStack_15778;
  pfStack_15790 = (fdb_doc *)0x110726;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"./compact_test_manual_compacted.meta",
                   (fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e7;
  pcVar11 = auStack_15778;
  pfStack_15790 = (fdb_doc *)0x110748;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_non",(fdb_config *)auStack_156e8);
  if (fVar2 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108ec;
  pcVar11 = auStack_15778;
  pfStack_15790 = (fdb_doc *)0x11076a;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_non.manual",(fdb_config *)auStack_156e8
                  );
  if (fVar2 == FDB_RESULT_NO_SUCH_FILE) {
    lVar13 = 0;
    do {
      pfStack_15790 = (fdb_doc *)0x110782;
      fdb_doc_free((fdb_doc *)(&afStack_15288[0].keylen)[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 10000);
    pfStack_15790 = (fdb_doc *)0x110793;
    fdb_shutdown();
    pfStack_15790 = (fdb_doc *)0x110798;
    memleak_end();
    pcVar11 = "%s PASSED\n";
    if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
      pcVar11 = "%s FAILED\n";
    }
    pfStack_15790 = (fdb_doc *)0x1107c9;
    fprintf(_stderr,pcVar11,"compaction daemon test");
    return;
  }
  goto LAB_001108f1;
LAB_00110ea0:
  auto_compaction_with_custom_cmp_function();
LAB_00110ea5:
  auto_compaction_with_custom_cmp_function();
LAB_00110eaa:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110eaf;
LAB_001107eb:
  pfStack_15790 = (fdb_doc *)0x1107f6;
  compaction_daemon_test();
  unaff_RBP = pfVar10;
LAB_001107f6:
  pfVar10 = unaff_RBP;
  pfStack_15790 = (fdb_doc *)0x1107fb;
  compaction_daemon_test();
LAB_001107fb:
  pfStack_15790 = (fdb_doc *)0x110806;
  pcVar11 = (char *)unaff_R12;
  compaction_daemon_test();
  unaff_RBP = pfVar10;
LAB_00110806:
  _Var16._M_i = (__int_type_conflict)apfStack_15588;
  pcVar9 = "key%04d";
  pfStack_15790 = (fdb_doc *)0x11080b;
  compaction_daemon_test();
LAB_0011080b:
  pfStack_15790 = (fdb_doc *)0x110810;
  compaction_daemon_test();
LAB_00110810:
  pfStack_15790 = (fdb_doc *)0x110815;
  compaction_daemon_test();
LAB_00110815:
  pfStack_15790 = (fdb_doc *)0x11081a;
  compaction_daemon_test();
LAB_0011081a:
  pfStack_15790 = (fdb_doc *)0x11081f;
  compaction_daemon_test();
LAB_0011081f:
  pfStack_15790 = (fdb_doc *)0x110824;
  compaction_daemon_test();
LAB_00110824:
  pfStack_15790 = (fdb_doc *)0x110829;
  compaction_daemon_test();
LAB_00110829:
  pfStack_15790 = (fdb_doc *)0x11082e;
  compaction_daemon_test();
LAB_0011082e:
  pfStack_15790 = (fdb_doc *)0x110833;
  compaction_daemon_test();
  pfVar10 = unaff_RBP;
LAB_00110833:
  pfStack_15790 = (fdb_doc *)0x110838;
  compaction_daemon_test();
LAB_00110838:
  pfStack_15790 = (fdb_doc *)0x11083d;
  compaction_daemon_test();
LAB_0011083d:
  pfStack_15790 = (fdb_doc *)0x110842;
  compaction_daemon_test();
LAB_00110842:
  pfStack_15790 = (fdb_doc *)0x110847;
  compaction_daemon_test();
LAB_00110847:
  pfStack_15790 = (fdb_doc *)0x11084c;
  compaction_daemon_test();
LAB_0011084c:
  pfStack_15790 = (fdb_doc *)0x110851;
  compaction_daemon_test();
LAB_00110851:
  pfStack_15790 = (fdb_doc *)0x110856;
  compaction_daemon_test();
LAB_00110856:
  pfStack_15790 = (fdb_doc *)0x11085b;
  compaction_daemon_test();
LAB_0011085b:
  pfStack_15790 = (fdb_doc *)0x110860;
  compaction_daemon_test();
LAB_00110860:
  pfStack_15790 = (fdb_doc *)0x110865;
  compaction_daemon_test();
LAB_00110865:
  pfStack_15790 = (fdb_doc *)0x11086a;
  compaction_daemon_test();
LAB_0011086a:
  pfStack_15790 = (fdb_doc *)0x11086f;
  compaction_daemon_test();
LAB_0011086f:
  pfStack_15790 = (fdb_doc *)0x110874;
  compaction_daemon_test();
LAB_00110874:
  pfStack_15790 = (fdb_doc *)0x110879;
  compaction_daemon_test();
LAB_00110879:
  pfStack_15790 = (fdb_doc *)0x11087e;
  compaction_daemon_test();
LAB_0011087e:
  pfStack_15790 = (fdb_doc *)0x110883;
  compaction_daemon_test();
LAB_00110883:
  pfStack_15790 = (fdb_doc *)0x110888;
  compaction_daemon_test();
LAB_00110888:
  pfStack_15790 = (fdb_doc *)0x11088d;
  compaction_daemon_test();
LAB_0011088d:
  pfStack_15790 = (fdb_doc *)0x110892;
  compaction_daemon_test();
LAB_00110892:
  pfStack_15790 = (fdb_doc *)0x110897;
  compaction_daemon_test();
LAB_00110897:
  pfStack_15790 = (fdb_doc *)0x11089c;
  compaction_daemon_test();
LAB_0011089c:
  pfStack_15790 = (fdb_doc *)0x1108a1;
  compaction_daemon_test();
LAB_001108a1:
  pfStack_15790 = (fdb_doc *)0x1108a6;
  compaction_daemon_test();
LAB_001108a6:
  pfStack_15790 = (fdb_doc *)0x1108ab;
  compaction_daemon_test();
LAB_001108ab:
  pfStack_15790 = (fdb_doc *)0x1108b0;
  compaction_daemon_test();
LAB_001108b0:
  pfStack_15790 = (fdb_doc *)0x1108b5;
  compaction_daemon_test();
LAB_001108b5:
  pfStack_15790 = (fdb_doc *)0x1108ba;
  compaction_daemon_test();
LAB_001108ba:
  pfStack_15790 = (fdb_doc *)0x1108bf;
  compaction_daemon_test();
LAB_001108bf:
  pfStack_15790 = (fdb_doc *)0x1108c4;
  compaction_daemon_test();
LAB_001108c4:
  pfStack_15790 = (fdb_doc *)0x1108c9;
  compaction_daemon_test();
LAB_001108c9:
  pfStack_15790 = (fdb_doc *)0x1108ce;
  compaction_daemon_test();
LAB_001108ce:
  pfStack_15790 = (fdb_doc *)0x1108d3;
  compaction_daemon_test();
LAB_001108d3:
  pfStack_15790 = (fdb_doc *)0x1108d8;
  compaction_daemon_test();
LAB_001108d8:
  pfStack_15790 = (fdb_doc *)0x1108dd;
  compaction_daemon_test();
LAB_001108dd:
  pfStack_15790 = (fdb_doc *)0x1108e2;
  compaction_daemon_test();
LAB_001108e2:
  pfStack_15790 = (fdb_doc *)0x1108e7;
  compaction_daemon_test();
LAB_001108e7:
  pfStack_15790 = (fdb_doc *)0x1108ec;
  compaction_daemon_test();
LAB_001108ec:
  pfStack_15790 = (fdb_doc *)0x1108f1;
  compaction_daemon_test();
LAB_001108f1:
  pfStack_15790 = (fdb_doc *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_15928 = (fdb_doc *)0x110916;
  aStack_157b8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar9;
  pfStack_157b0 = unaff_R12;
  pfStack_157a8 = unaff_R13;
  pfStack_157a0 = pfVar8;
  ppfStack_15798 = (fdb_doc **)_Var16._M_i;
  pfStack_15790 = pfVar10;
  gettimeofday(&tStack_158d8,(__timezone_ptr_t)0x0);
  pfStack_15928 = (fdb_doc *)0x11091b;
  memleak_start();
  pfStack_15928 = (fdb_doc *)0x110927;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_15928 = (fdb_doc *)0x110934;
  fdb_get_default_config();
  uStack_15882 = 1;
  uStack_15878._0_2_ = 1;
  uStack_15878._2_2_ = 0;
  uStack_15878._4_4_ = 0;
  pfStack_15928 = (fdb_doc *)0x110955;
  fVar2 = fdb_open(&pfStack_15918,"compact_test",(fdb_config *)(auStack_158c8 + 0x18));
  pfVar14 = (fdb_config *)(auStack_158c8 + 0x18);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfVar14 = (fdb_config *)auStack_158c8;
    pfStack_15928 = (fdb_doc *)0x11096a;
    fdb_get_default_kvs_config();
    pfStack_15928 = (fdb_doc *)0x11097c;
    fVar2 = fdb_kvs_open_default(pfStack_15918,&pfStack_15910,(fdb_kvs_config *)pfVar14);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110aad;
    pfStack_15928 = (fdb_doc *)0x110993;
    gettimeofday(&tStack_158e8,(__timezone_ptr_t)0x0);
    pfStack_15928 = (fdb_doc *)0x1109a3;
    printf("wait for %d seconds..\n",(ulong)pcVar11 & 0xffffffff);
    tVar17.tv_usec = tStack_158e8.tv_usec;
    tVar17.tv_sec = tStack_158e8.tv_sec;
    unaff_R13 = (fdb_kvs_handle *)((long)&atStack_15908[1].tv_sec + 1);
    pfVar10 = (fdb_doc *)0x0;
    do {
      iVar3 = (int)pfVar10;
      pfStack_15928 = (fdb_doc *)0x1109c4;
      sprintf((char *)unaff_R13,"%d",pfVar10);
      unaff_R12 = pfStack_15910;
      pfStack_15928 = (fdb_doc *)0x1109d1;
      sVar4 = strlen((char *)unaff_R13);
      pfStack_15928 = (fdb_doc *)0x1109ec;
      fVar2 = fdb_set_kv(unaff_R12,unaff_R13,sVar4,"value",5);
      pfVar14 = (fdb_config *)tStack_158e8.tv_sec;
      _Var16._M_i = tStack_158e8.tv_usec;
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_00110aa3:
        pfStack_15928 = (fdb_doc *)0x110aa8;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa8;
      }
      pfStack_15928 = (fdb_doc *)0x110a00;
      fVar2 = fdb_commit(pfStack_15918,'\0');
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_15928 = (fdb_doc *)0x110aa3;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa3;
      }
      pfStack_15928 = (fdb_doc *)0x110a14;
      gettimeofday((timeval *)atStack_15908,(__timezone_ptr_t)0x0);
      pfStack_15928 = (fdb_doc *)0x110a29;
      tVar18 = _utime_gap(tVar17,atStack_15908[0]);
    } while (((fdb_kvs_handle *)tVar18.tv_sec < pcVar11) &&
            (pfVar10 = (fdb_doc *)(ulong)(iVar3 + 1), iVar3 != 99999));
    pfStack_15928 = (fdb_doc *)0x110a49;
    fVar2 = fdb_close(pfStack_15918);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110ab2;
    pfStack_15928 = (fdb_doc *)0x110a52;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_15928 = (fdb_doc *)0x110a5b;
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pfStack_15928 = (fdb_doc *)0x110a8c;
      fprintf(_stderr,pcVar11,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110aa8:
    pfStack_15928 = (fdb_doc *)0x110aad;
    auto_compaction_with_concurrent_insert_test();
LAB_00110aad:
    pfStack_15928 = (fdb_doc *)0x110ab2;
    auto_compaction_with_concurrent_insert_test();
LAB_00110ab2:
    pfStack_15928 = (fdb_doc *)0x110ab7;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_15928 = (fdb_doc *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_15950 = (fdb_kvs_handle *)pcVar11;
  pfStack_15948 = unaff_R12;
  pfStack_15940 = unaff_R13;
  pfStack_15938 = pfVar14;
  ppfStack_15930 = (fdb_doc **)_Var16._M_i;
  pfStack_15928 = pfVar10;
  gettimeofday(&tStack_15c58,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_15cc8._32_8_ = (btree *)0x0;
  auStack_15cc8._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_15a48.wal_threshold = 0x1000;
  fStack_15a48.compaction_mode = '\x01';
  fStack_15a48.compaction_threshold = '\n';
  fStack_15a48.compactor_sleep_duration = 1;
  info_01 = (fdb_file_info *)0x14e0c5;
  pfVar8 = (fdb_kvs_handle *)&pfStack_15ce8;
  kvs_config_00 = (fdb_file_info *)0x1;
  fVar2 = fdb_open_custom_cmp((fdb_file_handle **)pfVar8,"compact_test",&fStack_15a48,1,
                              (char **)(auStack_15cc8 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_15cc8 + 0x18),(void **)0x0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_15cc8._16_8_ = afStack_15c48[0].doc_count;
    auStack_15cc8._0_8_ = afStack_15c48[0].filename;
    auStack_15cc8._8_8_ = afStack_15c48[0].new_filename;
    info_01 = (fdb_file_info *)auStack_15ce0;
    pfVar8 = pfStack_15ce8;
    fVar2 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_15ce8,(fdb_kvs_handle **)info_01,
                       (fdb_kvs_config *)auStack_15cc8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110eb4;
    info_01 = (fdb_file_info *)auStack_15cd0;
    kvs_config_00 = (fdb_file_info *)auStack_15cc8;
    pfVar8 = pfStack_15ce8;
    fVar2 = fdb_kvs_open((fdb_file_handle *)pfStack_15ce8,(fdb_kvs_handle **)info_01,"db",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110eb9;
    uVar6 = 0;
    do {
      sprintf((char *)afStack_15c48,"key%06d",uVar6);
      sprintf((char *)afStack_15b48,"body%06d",uVar6);
      pfVar8 = (fdb_kvs_handle *)auStack_15ce0._0_8_;
      sVar4 = strlen((char *)afStack_15c48);
      sVar5 = strlen((char *)afStack_15b48);
      kvs_config_00 = afStack_15b48;
      info_01 = afStack_15c48;
      fVar2 = fdb_set_kv(pfVar8,afStack_15c48,sVar4,afStack_15b48,sVar5);
      handle = auStack_15cd0;
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_00110e9b:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110ea0;
      }
      sVar4 = strlen((char *)afStack_15c48);
      sVar5 = strlen((char *)afStack_15b48);
      kvs_config_00 = afStack_15b48;
      info_01 = afStack_15c48;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)handle,afStack_15c48,sVar4,afStack_15b48,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar8 = (fdb_kvs_handle *)handle;
        goto LAB_00110e9b;
      }
      uVar12 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar12;
    } while (uVar12 != 10000);
    kvs_config_00 = (fdb_file_info *)auStack_15cc8;
    auStack_15cc8._8_8_ = _compact_test_keycmp;
    info_01 = (fdb_file_info *)(auStack_15ce0 + 8);
    pfVar8 = pfStack_15ce8;
    fVar2 = fdb_kvs_open((fdb_file_handle *)pfStack_15ce8,(fdb_kvs_handle **)info_01,"db_custom",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110ebe;
    info_01 = afStack_15c48;
    sprintf((char *)info_01,"key%06d",0);
    kvs_config_00 = afStack_15b48;
    sprintf((char *)kvs_config_00,"body%06d",0);
    sVar4 = strlen((char *)info_01);
    sVar5 = strlen((char *)kvs_config_00);
    fVar2 = fdb_set_kv((fdb_kvs_handle *)auStack_15ce0._8_8_,info_01,sVar4,kvs_config_00,sVar5);
    pfVar8 = (fdb_kvs_handle *)auStack_15ce0._8_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110ec3;
    info_01 = (fdb_file_info *)0x0;
    pfVar8 = pfStack_15ce8;
    fVar2 = fdb_commit((fdb_file_handle *)pfStack_15ce8,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110ec8;
    uVar6 = 0;
    uVar15 = 0;
    do {
      sprintf((char *)afStack_15c48,"key%06d",uVar15);
      sprintf((char *)afStack_15b48,"body%06d",uVar15);
      pfVar8 = (fdb_kvs_handle *)auStack_15ce0._0_8_;
      sVar4 = strlen((char *)afStack_15c48);
      sVar5 = strlen((char *)afStack_15b48);
      kvs_config_00 = afStack_15b48;
      info_01 = afStack_15c48;
      fVar2 = fdb_set_kv(pfVar8,afStack_15c48,sVar4,afStack_15b48,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110ea5;
      info_01 = (fdb_file_info *)(auStack_15cc8 + 0x28);
      pfVar8 = pfStack_15ce8;
      fVar2 = fdb_get_file_info((fdb_file_handle *)pfStack_15ce8,info_01);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110ea0;
      if (uVar6 < uStack_15c78) {
        uVar6 = uStack_15c78;
      }
      uVar12 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar12;
    } while (uVar12 != 10000);
    info_01 = (fdb_file_info *)0x0;
    pfVar8 = pfStack_15ce8;
    fVar2 = fdb_commit((fdb_file_handle *)pfStack_15ce8,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110ecd;
    info_01 = (fdb_file_info *)(auStack_15cc8 + 0x28);
    pfVar8 = pfStack_15ce8;
    fVar2 = fdb_get_file_info((fdb_file_handle *)pfStack_15ce8,info_01);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110ed2;
    if (uVar6 < uStack_15c78) {
      uVar6 = uStack_15c78;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar6);
    do {
      sleep(1);
      info_01 = (fdb_file_info *)(auStack_15cc8 + 0x28);
      pfVar8 = pfStack_15ce8;
      fVar2 = fdb_get_file_info((fdb_file_handle *)pfStack_15ce8,
                                (fdb_file_info *)(auStack_15cc8 + 0x28));
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110eaa;
    } while (uVar6 <= uStack_15c78);
    fVar2 = fdb_close((fdb_file_handle *)pfStack_15ce8);
    pfVar8 = pfStack_15ce8;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_shutdown();
      pfVar8 = pfStack_15ce8;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar11 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar11 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar11,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110edc;
    }
  }
  else {
LAB_00110eaf:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb4:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb9:
    auto_compaction_with_custom_cmp_function();
LAB_00110ebe:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec3:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec8:
    auto_compaction_with_custom_cmp_function();
LAB_00110ecd:
    auto_compaction_with_custom_cmp_function();
LAB_00110ed2:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110edc:
  auto_compaction_with_custom_cmp_function();
  if (info_01 == kvs_config_00) {
    memcmp(pfVar8,__s2,(size_t)info_01);
    return;
  }
  if (info_01 < kvs_config_00) {
    kvs_config_00 = info_01;
  }
  memcmp(pfVar8,__s2,(size_t)kvs_config_00);
  return;
}

Assistant:

void auto_recover_compact_ok_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 3;
    fdb_file_handle *dbfile, *dbfile_new;
    fdb_kvs_handle *db;
    fdb_kvs_handle *db_new;
    fdb_doc **doc = alca(fdb_doc *, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL " compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "auto_recover_compact_ok_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_open(&dbfile_new, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile_new, &db_new, &kvs_config);
    status = fdb_set_log_callback(db_new, logCallbackFunc,
                                  (void *) "auto_recover_compact_ok_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert first two documents
    for (i=0;i<2;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove second doc
    fdb_doc_create(&rdoc, doc[1]->key, doc[1]->keylen, doc[1]->meta, doc[1]->metalen, NULL, 0);
    rdoc->deleted = true;
    fdb_set(db, rdoc);
    fdb_doc_free(rdoc);

    // commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // perform compaction using one handle
    fdb_compact(dbfile, (char *) "./compact_test2");

    // save the old file after compaction is done ..
    r = system(SHELL_COPY " compact_test1 compact_test11 > errorlog.txt");
    (void)r;

    // now insert third doc: it should go to the newly compacted file.
    sprintf(keybuf, "key%d", i);
    sprintf(metabuf, "meta%d", i);
    sprintf(bodybuf, "body%d", i);
    fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
        (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc[i]);

    // commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // close both the db files ...
    fdb_kvs_close(db);
    fdb_kvs_close(db_new);
    fdb_close(dbfile);
    fdb_close(dbfile_new);

    // restore the old file after close is done ..
    r = system(SHELL_MOVE " compact_test11 compact_test1 > errorlog.txt");
    (void)r;

    // now open the old saved compacted file, it should automatically recover
    // and use the new file since compaction was done successfully
    fdb_open(&dbfile_new, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile_new, &db_new, &kvs_config);
    status = fdb_set_log_callback(db_new, logCallbackFunc,
                                  (void *) "auto_recover_compact_ok_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // retrieve documents using the old handle and expect all 3 docs
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db_new, rdoc);

        if (i != 1) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        }else{
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
    }
    // check this handle's filename it should point to newly compacted file
    fdb_file_info info;
    fdb_get_file_info(dbfile_new, &info);
    TEST_CHK(!strcmp("./compact_test2", info.filename));

    // close the file
    fdb_kvs_close(db_new);
    fdb_close(dbfile_new);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("auto recovery after compaction test");
}